

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O2

void __thiscall
dg::dda::MemorySSATransformation::findDefinitionsInSubgraph
          (MemorySSATransformation *this,RWNode *phi,RWNodeCall *C,DefSite *ds,RWSubgraph *subg)

{
  undefined8 *puVar1;
  RWBBlock *this_00;
  bool bVar2;
  SubgraphInfo *pSVar3;
  SubgraphInfo *si;
  RWNode *pRVar4;
  _Base_ptr p_Var5;
  DiscreteInterval<dg::Offset> *subginterval;
  pointer this_01;
  DefinitionsMap<dg::dda::RWNode> *this_02;
  undefined8 *puVar6;
  DefUses *this_03;
  DefSite subgds;
  _Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  local_78;
  _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  local_60;
  
  pSVar3 = getSubgraphInfo(this,subg);
  si = getSubgraphInfo(this,subg);
  computeModRef(this,subg,si);
  this_02 = &(pSVar3->summary).outputs;
  DefinitionsMap<dg::dda::RWNode>::get
            ((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              *)&local_60,this_02,ds);
  this_03 = &phi->defuse;
  RWNode::DefUses::
  add<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
            (this_03,(set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                      *)&local_60);
  std::
  _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  ::~_Rb_tree(&local_60);
  DefinitionsMap<dg::dda::RWNode>::undefinedIntervals
            ((vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
              *)&local_78,this_02,ds);
  for (this_01 = local_78._M_impl.super__Vector_impl_data._M_start;
      this_01 != local_78._M_impl.super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
    pRVar4 = ds->target;
    subgds.len = ADT::DiscreteInterval<dg::Offset>::length(this_01);
    subgds.offset.offset = (this_01->start).offset;
    subgds.target = pRVar4;
    bVar2 = DefinitionsMap<dg::dda::RWNode>::definesTarget(&(si->modref).maydef,ds->target);
    if (bVar2) {
      pRVar4 = createPhi(this,&subgds,OUTARG);
      DefinitionsMap<dg::dda::RWNode>::add(this_02,&subgds,pRVar4);
      RWNode::DefUses::add(this_03,pRVar4);
      puVar1 = *(undefined8 **)(subg + 8);
      for (puVar6 = *(undefined8 **)subg; puVar6 != puVar1; puVar6 = puVar6 + 1) {
        this_00 = (RWBBlock *)*puVar6;
        if ((this_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
            super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>._successors.
            super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            *(pointer *)
             ((long)&(this_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                     super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                     _successors.
                     super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                     _M_impl.super__Vector_impl_data + 8)) {
          bVar2 = RWBBlock::isReturnBBlock(this_00);
          if (bVar2) {
            findDefinitions((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                            &local_60,this,this_00,ds);
            RWNode::DefUses::add<std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
                      (&pRVar4->defuse,
                       (vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)&local_60);
            std::_Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::~_Vector_base
                      ((_Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                       &local_60);
          }
        }
      }
    }
    else {
      bVar2 = ModRefInfo::mayDefineUnknown(&si->modref);
      if (bVar2) {
        pRVar4 = createPhi(this,&subgds,OUTARG);
        DefinitionsMap<dg::dda::RWNode>::add(this_02,&subgds,pRVar4);
        ModRefInfo::getMayDef
                  ((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                    *)&local_60,&si->modref,(RWNode *)UNKNOWN_MEMORY);
        for (p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != &local_60._M_impl.super__Rb_tree_header;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          RWNode::DefUses::add(&pRVar4->defuse,*(RWNode **)(p_Var5 + 1));
        }
        std::
        _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
        ::~_Rb_tree(&local_60);
        RWNode::DefUses::add(this_03,pRVar4);
      }
      findDefinitions((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)&local_60,
                      this,&C->super_RWNode,&subgds);
      RWNode::DefUses::add<std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
                (this_03,(vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)&local_60)
      ;
      std::_Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::~_Vector_base
                ((_Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)&local_60);
    }
  }
  std::
  _Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  ::~_Vector_base(&local_78);
  return;
}

Assistant:

void MemorySSATransformation::findDefinitionsInSubgraph(RWNode *phi,
                                                        RWNodeCall *C,
                                                        const DefSite &ds,
                                                        RWSubgraph *subg) {
    DBG_SECTION_BEGIN(tmp,
                      "Searching definitions in subgraph " << subg->getName());
    auto &summary = getSubgraphSummary(subg);
    auto &si = getSubgraphInfo(subg);
    computeModRef(subg, si);
    assert(si.modref.isInitialized());

    // Add the definitions that we have found in previous exploration
    phi->addDefUse(summary.getOutputs(ds));

    // search the definitions that we have not found yet
    for (auto &subginterval : summary.getUncoveredOutputs(ds)) {
        // we must create a new phi for each subgraph inside the subgraph
        // (these phis will be merged by the single 'phi').
        // Of course, we create them only when not already present.
        auto subgds =
                DefSite{ds.target, subginterval.start, subginterval.length()};

        // do not search the procedure if it cannot define the memory
        // (this saves creating PHI nodes). If it may define only
        // unknown memory, add that definitions directly and continue searching
        // before the call.
        if (!si.modref.mayDefine(ds.target)) {
            if (si.modref.mayDefineUnknown()) {
                auto *subgphi =
                        createPhi(subgds, /* type = */ RWNodeType::OUTARG);
                summary.addOutput(subgds, subgphi);
                for (const auto &it : si.modref.getMayDef(UNKNOWN_MEMORY)) {
                    subgphi->addDefUse(it);
                }
                phi->addDefUse(subgphi);
            }
            // continue the search before the call
            phi->addDefUse(findDefinitions(C, subgds));
            continue;
        }

        auto *subgphi = createPhi(subgds, /* type = */ RWNodeType::OUTARG);
        summary.addOutput(subgds, subgphi);
        phi->addDefUse(subgphi);

        // find the new phi operands
        for (auto *subgblock : subg->bblocks()) {
            if (subgblock->hasSuccessors()) {
                continue;
            }
            if (!subgblock->isReturnBBlock()) {
                // ignore blocks that does not return to this subgraph
                continue;
            }
            subgphi->addDefUse(findDefinitions(subgblock, ds));
        }
    }
    DBG_SECTION_END(tmp, "Done searching definitions in subgraph "
                                 << subg->getName());
}